

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXAlgorithms.h
# Opt level: O3

string * __thiscall
ZXing::ToString<unsigned_int,void>(string *__return_storage_ptr__,ZXing *this,uint val,int len)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  uint *local_50;
  long local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  uVar4 = (ulong)this & 0xffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)val);
  bVar5 = (int)this != 0;
  if (bVar5 && 0 < (int)val) {
    uVar1 = (ulong)val;
    do {
      uVar3 = (uint)uVar4;
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar1 - 1] =
           (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
      bVar5 = 9 < uVar3;
      if (uVar1 < 2) break;
      uVar1 = uVar1 - 1;
      uVar4 = uVar4 / 10;
    } while (9 < uVar3);
  }
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  plVar2 = (long *)__cxa_allocate_exception(0x30);
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Invalid value","");
  *plVar2 = (long)(plVar2 + 2);
  if (local_50 == &local_40) {
    *(uint *)(plVar2 + 2) = local_40;
    *(undefined4 *)((long)plVar2 + 0x14) = uStack_3c;
    *(undefined4 *)(plVar2 + 3) = uStack_38;
    *(undefined4 *)((long)plVar2 + 0x1c) = uStack_34;
  }
  else {
    *plVar2 = (long)local_50;
    plVar2[2] = CONCAT44(uStack_3c,local_40);
  }
  plVar2[1] = local_48;
  local_48 = 0;
  local_40 = local_40 & 0xffffff00;
  plVar2[4] = (long)"src/ZXAlgorithms.h";
  *(undefined2 *)(plVar2 + 5) = 0x74;
  *(undefined1 *)((long)plVar2 + 0x2a) = 1;
  local_50 = &local_40;
  __cxa_throw(plVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

std::string ToString(T val, int len)
{
	std::string result(len--, '0');
	if (val < 0)
		throw FormatError("Invalid value");
	for (; len >= 0 && val != 0; --len, val /= 10)
		result[len] = '0' + val % 10;
	if (val)
		throw FormatError("Invalid value");
	return result;
}